

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

int extract2fd(archive *a,char *pathname,int fd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t len_00;
  char *pcVar4;
  ssize_t sVar5;
  uchar *puVar6;
  size_t sVar7;
  int local_4c;
  int acret;
  int n;
  uchar *end;
  uchar *q;
  uchar *p;
  ssize_t len;
  int warn;
  int text;
  int cr;
  int fd_local;
  char *pathname_local;
  archive *a_local;
  
  len._4_4_ = a_opt;
  bVar2 = false;
  bVar1 = false;
  local_4c = 0;
  do {
    if (((fd != 1) && (tty != 0)) && (local_4c % 4 == 0)) {
      info(" %c\b\b",(ulong)(uint)(int)spinner[(long)(local_4c / 4) & 3],
           (long)local_4c % 4 & 0xffffffff);
    }
    len_00 = archive_read_data(a,buffer,0x2000);
    if (((long)len_00 < 0) && ((int)len_00 != 0)) {
      pcVar4 = archive_error_string(a);
      errorx("%s",pcVar4);
    }
    if ((a_opt != 0) && (bVar1)) {
      if (((len_00 == 0) || (buffer[0] != '\n')) && (sVar5 = write(fd,"\r",1), sVar5 != 1)) {
        error("write(\'%s\')",pathname);
      }
      bVar1 = false;
    }
    if (len_00 == 0) {
      return len._4_4_;
    }
    puVar6 = buffer + len_00;
    if (((a_opt != 0) && (local_4c == 0)) && (iVar3 = check_binary(buffer,len_00), iVar3 != 0)) {
      len._4_4_ = 0;
    }
    if ((a_opt == 0) || (len._4_4_ == 0)) {
      sVar7 = write(fd,buffer,len_00);
      if (sVar7 != len_00) {
        error("write(\'%s\')",pathname);
      }
    }
    else {
      q = buffer;
      while (q < puVar6) {
        for (end = q; end < puVar6; end = end + 1) {
          if (((!bVar2) && (*end < 0x20)) && ((1 << (*end & 0x1f) & 0xf3ffc07fU) != 0)) {
            warningx("%s may be corrupted due to weak text file detection heuristic",pathname);
            bVar2 = true;
          }
          if (*end == '\r') {
            if (end + 1 == puVar6) {
              bVar1 = true;
              break;
            }
            if (end[1] == '\n') break;
          }
        }
        sVar5 = write(fd,q,(long)end - (long)q);
        if (sVar5 != (long)end - (long)q) {
          error("write(\'%s\')",pathname);
        }
        q = end + 1;
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

static int
extract2fd(struct archive *a, char *pathname, int fd)
{
	int cr, text, warn;
	ssize_t len;
	unsigned char *p, *q, *end;

	text = a_opt;
	warn = 0;
	cr = 0;

	/* loop over file contents and write to fd */
	for (int n = 0; ; n++) {
		if (fd != STDOUT_FILENO)
			if (tty && (n % 4) == 0)
				info(" %c\b\b", spinner[(n / 4) % sizeof spinner]);

		len = archive_read_data(a, buffer, sizeof buffer);

		if (len < 0)
			ac(len);

		/* left over CR from previous buffer */
		if (a_opt && cr) {
			if (len == 0 || buffer[0] != '\n')
				if (write(fd, "\r", 1) != 1)
					error("write('%s')", pathname);
			cr = 0;
		}

		/* EOF */
		if (len == 0)
			break;
		end = buffer + len;

		/*
		 * Detect whether this is a text file.  The correct way to
		 * do this is to check the least significant bit of the
		 * "internal file attributes" field of the corresponding
		 * file header in the central directory, but libarchive
		 * does not provide access to this field, so we have to
		 * guess by looking for non-ASCII characters in the
		 * buffer.  Hopefully we won't guess wrong.  If we do
		 * guess wrong, we print a warning message later.
		 */
		if (a_opt && n == 0) {
			if (check_binary(buffer, len))
				text = 0;
		}

		/* simple case */
		if (!a_opt || !text) {
			if (write(fd, buffer, len) != len)
				error("write('%s')", pathname);
			continue;
		}

		/* hard case: convert \r\n to \n (sigh...) */
		for (p = buffer; p < end; p = q + 1) {
			for (q = p; q < end; q++) {
				if (!warn && BYTE_IS_BINARY(*q)) {
					warningx("%s may be corrupted due"
					    " to weak text file detection"
					    " heuristic", pathname);
					warn = 1;
				}
				if (q[0] != '\r')
					continue;
				if (&q[1] == end) {
					cr = 1;
					break;
				}
				if (q[1] == '\n')
					break;
			}
			if (write(fd, p, q - p) != q - p)
				error("write('%s')", pathname);
		}
	}

	return text;
}